

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trap.c
# Opt level: O0

_Bool square_remove_all_traps(chunk_conflict2 *c,loc_conflict grid)

{
  trap_kind_conflict *ptVar1;
  _Bool _Var2;
  square_conflict *psVar3;
  trap_kind_conflict *ptVar4;
  bool bVar5;
  trap *next_trap;
  _Bool were_there_traps;
  trap_kind_conflict *rune;
  trap *trap;
  chunk_conflict2 *c_local;
  loc_conflict grid_local;
  
  psVar3 = square((chunk *)c,grid);
  rune = (trap_kind_conflict *)psVar3->trap;
  ptVar4 = lookup_trap("glyph of warding");
  bVar5 = rune != (trap_kind_conflict *)0x0;
  while (rune != (trap_kind_conflict *)0x0) {
    ptVar1 = (trap_kind_conflict *)rune->desc;
    if ((trap_kind_conflict *)rune->text == ptVar4) {
      c->feeling_squares = c->feeling_squares - 0x100;
    }
    mem_free(rune);
    rune = ptVar1;
  }
  square_set_trap((chunk *)c,grid,(trap *)0x0);
  psVar3 = square((chunk *)c,grid);
  flag_off(psVar3->info,3,9);
  _Var2 = square_isseen((chunk *)c,grid);
  if (_Var2) {
    square_memorize_traps(c,grid);
    square_light_spot((chunk *)c,(loc)grid);
  }
  return bVar5;
}

Assistant:

bool square_remove_all_traps(struct chunk *c, struct loc grid)
{
	struct trap *trap = square(c, grid)->trap;
	struct trap_kind *rune = lookup_trap("glyph of warding");
	bool were_there_traps = trap == NULL ? false : true;

	while (trap) {
		struct trap *next_trap = trap->next;
		/* Keep count of glyphs of warding */
		if (trap->kind == rune) {
			c->feeling_squares -= (1 << 8);
		}
		mem_free(trap);
		trap = next_trap;
	}

	square_set_trap(c, grid, NULL);
	sqinfo_off(square(c, grid)->info, SQUARE_TRAP);

	/* Refresh grids that the character can see */
	if (square_isseen(c, grid)) {
		square_memorize_traps(c, grid);
		square_light_spot(c, grid);
	}

	return were_there_traps;
}